

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte bVar1;
  bool bVar2;
  hugeint_t *phVar3;
  hugeint_t *phVar4;
  hugeint_t *phVar5;
  byte in_CL;
  Vector *in_RDX;
  idx_t in_RSI;
  hugeint_t hVar6;
  hugeint_t *result_data;
  hugeint_t *rdata;
  hugeint_t *ldata;
  ValidityMask *mask;
  undefined1 fun_00;
  hugeint_t in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)in_stack_ffffffffffffffb8.upper,in_stack_ffffffffffffffb8.lower._7_1_);
  phVar3 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x210e314);
  phVar4 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x210e323);
  phVar5 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x210e332);
  bVar2 = ConstantVector::IsNull((Vector *)0x210e341);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x210e34f), !bVar2)) {
    mask = (ValidityMask *)phVar3->lower;
    fun_00 = (undefined1)((ulong)phVar3->upper >> 0x38);
    ConstantVector::Validity(in_RDX);
    hVar6.upper = (int64_t)phVar4;
    hVar6.lower = (uint64_t)phVar5;
    hVar6 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseXOROperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                      ((bool)fun_00,hVar6,in_stack_ffffffffffffffb8,mask,in_RSI);
    phVar5->lower = hVar6.lower;
    phVar5->upper = hVar6.upper;
    return;
  }
  ConstantVector::SetNull
            ((Vector *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),SUB81((ulong)phVar3 >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}